

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vk_mem_alloc.h
# Opt level: O0

void __thiscall VmaJsonWriter::ContinueString_Size(VmaJsonWriter *this,size_t n)

{
  undefined8 in_RSI;
  VmaJsonWriter *in_RDI;
  
  WriteSize(in_RDI,in_RSI);
  return;
}

Assistant:

void VmaJsonWriter::ContinueString_Size(size_t n)
{
    VMA_ASSERT(m_InsideString);
    // Fix for AppleClang incorrect type casting
    // TODO: Change to if constexpr when C++17 used as minimal standard
    WriteSize(n, std::is_same<size_t, uint64_t>{});
}